

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_escaped_string<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,basic_string_view<char> str)

{
  char *in_RCX;
  detail *this;
  detail *begin;
  find_escape_result<char> escape;
  
  this = (detail *)str.data_;
  escape.begin = (char *)out.container;
  basic_appender<char>::operator=((basic_appender<char> *)&escape,'\"');
  begin = this + str.size_;
  do {
    find_escape(&escape,this,(char *)begin,in_RCX);
    buffer<char>::append<char>(out.container,(char *)this,escape.begin);
    this = (detail *)escape.end;
    if (escape.end == (char *)0x0) break;
    out = write_escaped_cp<fmt::v11::basic_appender<char>,char>(out,&escape);
  } while (this != begin);
  escape.begin = (char *)out.container;
  basic_appender<char>::operator=((basic_appender<char> *)&escape,'\"');
  return (basic_appender<char>)out.container;
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}